

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O3

void __thiscall ICOReader::readColorTable(ICOReader *this,QImage *image)

{
  undefined8 uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QImage local_60 [16];
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->iod == (QIODevice *)0x0) {
LAB_00104246:
    QImage::QImage(local_60);
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_48 = (undefined8 *)0xaaaaaaaaaaaaaaaa;
    uStack_40 = 0xaaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_48);
    uVar1 = local_50;
    local_48 = &QImageIOPlugin::staticMetaObject;
    local_50 = 0;
    local_38 = *(undefined8 *)(image + 0x10);
    *(undefined8 *)(image + 0x10) = uVar1;
    QImage::~QImage((QImage *)&local_48);
    QImage::~QImage(local_60);
  }
  else {
    QImage::setColorCount((int)image);
    local_2c = 0xaaaaaaaa;
    if (0 < (this->icoAttrib).ncolors) {
      uVar3 = 0;
      do {
        lVar2 = QIODevice::read((char *)this->iod,(longlong)&local_2c);
        if (lVar2 != 4) goto LAB_00104246;
        QImage::setColor((int)image,uVar3);
        uVar3 = uVar3 + 1;
      } while ((int)uVar3 < (this->icoAttrib).ncolors);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ICOReader::readColorTable(QImage & image)
{
    if (iod) {
        image.setColorCount(icoAttrib.ncolors);
        uchar rgb[4];
        for (int i=0; i<icoAttrib.ncolors; i++) {
            if (iod->read((char*)rgb, 4) != 4) {
            image = QImage();
            break;
            }
            image.setColor(i, qRgb(rgb[2],rgb[1],rgb[0]));
        }
    } else {
        image = QImage();
    }
}